

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg.cpp
# Opt level: O0

void __thiscall spvtools::opt::CFG::AddEdges(CFG *this,BasicBlock *blk)

{
  BasicBlock *this_00;
  anon_class_16_2_1911a15e local_58;
  function<void_(unsigned_int)> local_48;
  BasicBlock *local_28;
  BasicBlock *const_blk;
  BasicBlock *pBStack_18;
  uint32_t blk_id;
  BasicBlock *blk_local;
  CFG *this_local;
  
  pBStack_18 = blk;
  blk_local = (BasicBlock *)this;
  const_blk._4_4_ = BasicBlock::id(blk);
  std::
  unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  ::operator[](&this->label2preds_,(key_type *)((long)&const_blk + 4));
  this_00 = pBStack_18;
  local_28 = pBStack_18;
  local_58.blk_id = const_blk._4_4_;
  local_58.this = this;
  std::function<void(unsigned_int)>::
  function<spvtools::opt::CFG::AddEdges(spvtools::opt::BasicBlock*)::__0,void>
            ((function<void(unsigned_int)> *)&local_48,&local_58);
  BasicBlock::ForEachSuccessorLabel(this_00,&local_48);
  std::function<void_(unsigned_int)>::~function(&local_48);
  return;
}

Assistant:

void CFG::AddEdges(BasicBlock* blk) {
  uint32_t blk_id = blk->id();
  // Force the creation of an entry, not all basic block have predecessors
  // (such as the entry blocks and some unreachables).
  label2preds_[blk_id];
  const auto* const_blk = blk;
  const_blk->ForEachSuccessorLabel(
      [blk_id, this](const uint32_t succ_id) { AddEdge(blk_id, succ_id); });
}